

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.c
# Opt level: O0

void err_clear_last_constant_time(int clear)

{
  uint uVar1;
  ERR_STATE *pEVar2;
  int top;
  ERR_STATE *es;
  int b;
  
  pEVar2 = ossl_err_get_state_int();
  if (pEVar2 != (ERR_STATE *)0x0) {
    b = pEVar2->top;
    constant_time_eq_int(0,0x2572c6);
    uVar1 = constant_time_select_int((uint)((ulong)pEVar2 >> 0x20),(int)pEVar2,b);
    pEVar2->err_flags[b] = uVar1 | pEVar2->err_flags[b];
  }
  return;
}

Assistant:

void err_clear_last_constant_time(int clear)
{
    ERR_STATE *es;
    int top;

    es = ossl_err_get_state_int();
    if (es == NULL)
        return;

    top = es->top;

    /*
     * Flag error as cleared but remove it elsewhere to avoid two errors
     * accessing the same error stack location, revealing timing information.
     */
    clear = constant_time_select_int(constant_time_eq_int(clear, 0),
                                     0, ERR_FLAG_CLEAR);
    es->err_flags[top] |= clear;
}